

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManCreateSat(Of_Man_t *p,int nCutsAll,Vec_Int_t *vFirst,Vec_Int_t *vCutNum,
                    Vec_Int_t *vBestNode,Vec_Int_t *vBestCut)

{
  void *pvVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  sat_solver *s;
  Gia_Man_t *pGVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  Vec_Int_t *pVVar10;
  uint *puVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int Lit;
  int pLits [2];
  timespec ts;
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  timespec local_60;
  Vec_Int_t *local_50;
  long local_48;
  int *local_40;
  Gia_Obj_t *local_38;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  iVar3 = clock_gettime(3,&local_60);
  if (iVar3 < 0) {
    local_68 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    local_68 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  s = sat_solver_new();
  pGVar6 = p->pGia;
  sat_solver_setnvars(s,pGVar6->nObjs + nCutsAll + ~(pGVar6->vCos->nSize + pGVar6->vCis->nSize));
  if (0 < vBestCut->nSize) {
    lVar8 = 0;
    do {
      Vec_IntPush(vBestNode,vBestCut->pArray[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < vBestCut->nSize);
  }
  piVar5 = vBestNode->pArray;
  uVar4 = vBestNode->nSize;
  if (0 < s->size) {
    lVar8 = 0;
    do {
      s->polarity[lVar8] = '\0';
      lVar8 = lVar8 + 1;
    } while (lVar8 < s->size);
  }
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      s->polarity[piVar5[uVar9]] = '\x01';
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  if (vBestCut->nSize < 0) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vBestNode->nSize = vBestNode->nSize - vBestCut->nSize;
  pGVar6 = p->pGia;
  local_50 = vBestNode;
  if (0 < pGVar6->nObjs) {
    lVar8 = 0;
    do {
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pGVar6->pObjs + lVar8;
      uVar4 = *(uint *)pGVar2;
      if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
        if ((vFirst->nSize <= lVar8) || (vCutNum->nSize <= lVar8)) goto LAB_007883bc;
        iVar3 = vFirst->pArray[lVar8];
        iVar15 = vCutNum->pArray[lVar8];
        p_00->nSize = 0;
        uVar4 = pGVar2->Value;
        if ((int)uVar4 < 0) goto LAB_00788340;
        Vec_IntPush(p_00,uVar4 * 2 + 1);
        if (0 < iVar15) {
          iVar12 = iVar3 * 2;
          do {
            if (iVar3 < 0) goto LAB_00788340;
            Vec_IntPush(p_00,iVar12);
            iVar12 = iVar12 + 2;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
        iVar3 = sat_solver_addclause(s,p_00->pArray,p_00->pArray + p_00->nSize);
        if (iVar3 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                        ,0x606,
                        "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
      }
      lVar8 = lVar8 + 1;
      pGVar6 = p->pGia;
    } while (lVar8 < pGVar6->nObjs);
  }
  pGVar6 = p->pGia;
  if (pGVar6->nObjs < 1) {
    iVar3 = 0;
  }
  else {
    lVar8 = 0;
    iVar3 = 0;
    do {
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
      local_38 = pGVar6->pObjs + lVar8;
      local_48 = lVar8;
      if ((~*(uint *)local_38 & 0x1fffffff) != 0 && -1 < (int)*(uint *)local_38) {
        if ((p->vCutSets).nSize <= lVar8) {
LAB_007883bc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = (p->vCutSets).pArray[lVar8];
        uVar7 = (int)uVar4 >> 0x10;
        if (((int)uVar7 < 0) || ((p->vPages).nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar1 = (p->vPages).pArray[uVar7];
        uVar9 = (ulong)(uVar4 & 0xffff);
        if (0 < *(int *)((long)pvVar1 + uVar9 * 4)) {
          local_40 = (int *)((long)pvVar1 + uVar9 * 4);
          puVar11 = (uint *)(local_40 + 1);
          iVar15 = 0;
          do {
            pGVar6 = p->pGia;
            iVar12 = pGVar6->nObjs + iVar3 + ~(pGVar6->vCos->nSize + pGVar6->vCis->nSize);
            if (iVar12 < 0) goto LAB_00788340;
            local_70 = iVar12 * 2 + 1;
            if ((int)local_38->Value < 0) goto LAB_00788340;
            local_6c = local_38->Value * 2;
            iVar12 = sat_solver_addclause(s,&local_70,(lit *)&local_68);
            if (iVar12 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                            ,0x613,
                            "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            uVar9 = (ulong)(*puVar11 & 0x1f);
            if ((*puVar11 & 0x1f) == 0) {
              uVar4 = 0;
            }
            else {
              uVar13 = 0;
              do {
                uVar4 = (uint)uVar9;
                uVar7 = puVar11[uVar13 + 1];
                if ((int)uVar7 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                if (uVar7 < 2) break;
                uVar7 = uVar7 >> 1;
                if (p->pGia->nObjs <= (int)uVar7) goto LAB_00788302;
                pGVar2 = p->pGia->pObjs;
                uVar4 = *(uint *)(pGVar2 + uVar7);
                if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
                  uVar4 = pGVar2[uVar7].Value;
                  if ((int)uVar4 < 0) goto LAB_00788340;
                  local_6c = uVar4 * 2;
                  iVar12 = sat_solver_addclause(s,&local_70,(lit *)&local_68);
                  if (iVar12 == 0) {
                    __assert_fail("RetValue",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                                  ,0x61b,
                                  "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                                 );
                  }
                }
                uVar13 = uVar13 + 1;
                uVar4 = *puVar11 & 0x1f;
                uVar9 = (ulong)uVar4;
              } while (uVar13 < uVar9);
            }
            iVar3 = iVar3 + 1;
            iVar15 = iVar15 + 1;
            puVar11 = puVar11 + (ulong)uVar4 + 4;
          } while (iVar15 < *local_40);
        }
      }
      lVar8 = local_48 + 1;
      pGVar6 = p->pGia;
    } while (lVar8 < pGVar6->nObjs);
  }
  if (iVar3 != nCutsAll) {
    __assert_fail("nCutCount == nCutsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                  ,0x620,
                  "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  pGVar6 = p->pGia;
  pVVar10 = pGVar6->vCos;
  if (0 < pVVar10->nSize) {
    lVar8 = 0;
    do {
      iVar3 = pVVar10->pArray[lVar8];
      if (((long)iVar3 < 0) || (pGVar6->nObjs <= iVar3)) goto LAB_00788302;
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pGVar6->pObjs + iVar3;
      *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) =
           *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) | 0x40000000;
      lVar8 = lVar8 + 1;
      pGVar6 = p->pGia;
      pVVar10 = pGVar6->vCos;
    } while (lVar8 < pVVar10->nSize);
  }
  pGVar6 = p->pGia;
  if (0 < pGVar6->nObjs) {
    lVar8 = 8;
    lVar14 = 0;
    do {
      pGVar2 = pGVar6->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(uint *)((long)pGVar2 + lVar8 + -8);
      if ((uVar4 & 0xc0000000) == 0x40000000 && (~uVar4 & 0x1fffffff) != 0) {
        if (*(int *)(&pGVar2->field_0x0 + lVar8) < 0) {
LAB_00788340:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        local_74 = *(int *)(&pGVar2->field_0x0 + lVar8) * 2;
        iVar3 = sat_solver_addclause(s,&local_74,&local_70);
        if (iVar3 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                        ,0x62b,
                        "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
      }
      lVar14 = lVar14 + 1;
      pGVar6 = p->pGia;
      lVar8 = lVar8 + 0xc;
    } while (lVar14 < pGVar6->nObjs);
  }
  pGVar6 = p->pGia;
  pVVar10 = pGVar6->vCos;
  if (0 < pVVar10->nSize) {
    lVar8 = 0;
    do {
      iVar3 = pVVar10->pArray[lVar8];
      if (((long)iVar3 < 0) || (pGVar6->nObjs <= iVar3)) {
LAB_00788302:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pGVar6->pObjs + iVar3;
      *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) =
           *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) &
           0xffffffffbfffffff;
      lVar8 = lVar8 + 1;
      pGVar6 = p->pGia;
      pVVar10 = pGVar6->vCos;
    } while (lVar8 < pVVar10->nSize);
  }
  uVar4 = (s->stats).clauses;
  p_00->nSize = 0;
  uVar7 = ~(pVVar10->nSize + pGVar6->vCis->nSize) + pGVar6->nObjs;
  if (p_00->nCap < (int)uVar7) {
    if (p_00->pArray == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar7 << 2);
    }
    else {
      piVar5 = (int *)realloc(p_00->pArray,(long)(int)uVar7 << 2);
    }
    p_00->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar7;
  }
  if (0 < (int)uVar7) {
    piVar5 = p_00->pArray;
    uVar9 = 0;
    do {
      piVar5[uVar9] = (int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  p_00->nSize = uVar7;
  Cnf_AddCardinConstrPairWise(s,p_00,local_50->nSize + -2,0);
  printf("Problem clauses = %d.  Cardinality clauses = %d.\n",(ulong)uVar4,
         (ulong)((s->stats).clauses - uVar4));
  iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
  if (iVar3 == 0) {
    printf("Undecided.  ");
  }
  if (iVar3 == 1) {
    printf("Satisfiable.  ");
  }
  if (iVar3 == -1) {
    printf("Unsatisfiable. ");
  }
  iVar12 = 3;
  iVar15 = clock_gettime(3,&local_60);
  if (iVar15 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  lVar8 = lVar8 + local_68;
  uVar9 = 0;
  Abc_Print(iVar12,"%s =","Time");
  Abc_Print(iVar12,"%9.2f sec\n",(double)lVar8 / 1000000.0);
  Sat_SolverPrintStats(_stdout,s);
  if (iVar3 == 1) {
    pGVar6 = p->pGia;
    uVar4 = 0;
    if ((pGVar6->vCos->nSize + pGVar6->vCis->nSize) - pGVar6->nObjs < -1) {
      uVar9 = 0;
      uVar4 = 0;
      do {
        if (((long)s->size <= (long)uVar9) ||
           (printf("%d",(ulong)(s->model[uVar9] == 1)), (long)s->size <= (long)uVar9))
        goto LAB_0078839d;
        uVar4 = uVar4 + (s->model[uVar9] == 1);
        uVar9 = uVar9 + 1;
        pGVar6 = p->pGia;
      } while ((long)uVar9 < (long)(~(pGVar6->vCos->nSize + pGVar6->vCis->nSize) + pGVar6->nObjs));
    }
    uVar7 = 0;
    printf(" Nodes = %d\n",(ulong)uVar4);
    pGVar6 = p->pGia;
    if ((int)uVar9 < pGVar6->nObjs + nCutsAll + ~(pGVar6->vCos->nSize + pGVar6->vCis->nSize)) {
      uVar9 = uVar9 & 0xffffffff;
      uVar7 = 0;
      do {
        if (((long)s->size <= (long)uVar9) ||
           (printf("%d",(ulong)(s->model[uVar9] == 1)), (long)s->size <= (long)uVar9)) {
LAB_0078839d:
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        uVar7 = uVar7 + (s->model[uVar9] == 1);
        uVar9 = uVar9 + 1;
        pGVar6 = p->pGia;
      } while ((int)uVar9 < pGVar6->nObjs + nCutsAll + ~(pGVar6->vCos->nSize + pGVar6->vCis->nSize))
      ;
    }
    printf(" LUTs = %d\n",(ulong)uVar7);
  }
  sat_solver_delete(s);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return;
}

Assistant:

void Of_ManCreateSat( Of_Man_t * p, int nCutsAll, Vec_Int_t * vFirst, Vec_Int_t * vCutNum, Vec_Int_t * vBestNode, Vec_Int_t * vBestCut )
{
    extern void Cnf_AddCardinConstrPairWise( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict );

    Gia_Obj_t * pObj, * pVar;
    int * pCutSet, * pCut;
    int i, k, v, c, Var, Lit, pLits[2], status, RetValue, nCutCount, nClauses;
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    abctime clk = Abc_Clock();

    // start solver
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, Gia_ManAndNum(p->pGia) + nCutsAll );

    // set polarity
    Vec_IntAppend( vBestNode, vBestCut );
    //Vec_IntPrint( vBestNode );
    sat_solver_set_polarity( pSat, Vec_IntArray(vBestNode), Vec_IntSize(vBestNode) );
    Vec_IntShrink( vBestNode, Vec_IntSize(vBestNode) - Vec_IntSize(vBestCut) );

    // add clauses for nodes
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        int iFirst = Vec_IntEntry(vFirst, i);
        int nCuts = Vec_IntEntry(vCutNum, i);
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_Var2Lit(pObj->Value, 1) );
        for ( c = 0; c < nCuts; c++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iFirst + c, 0) );
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( RetValue );
    }

    // add clauses for cuts
    nCutCount = 0;
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        pCutSet = Of_ObjCutSet(p, i);
        Of_SetForEachCut( pCutSet, pCut, k )
        {
            pLits[0] = Abc_Var2Lit( Gia_ManAndNum(p->pGia) + nCutCount, 1 );
            pLits[1] = Abc_Var2Lit( pObj->Value, 0 );
            RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );
            assert( RetValue );
            Of_CutForEachVar( pCut, Var, v )
            {
                pVar = Gia_ManObj(p->pGia, Var);
                if ( !Gia_ObjIsAnd(pVar) )
                    continue;
                pLits[1] = Abc_Var2Lit( pVar->Value, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );
                assert( RetValue );
            }
            nCutCount++;
        }
    }
    assert( nCutCount == nCutsAll );

    // mark CO drivers
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    // set used nodes to 1
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( pObj->fMark0 )
        {
            Lit = Abc_Var2Lit( pObj->Value, 0 );
            RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
            assert( RetValue );
        }
    // unmark CO drivers
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 0;

//    Sat_SolverWriteDimacs( pSat, "temp.cnf", NULL, NULL, 0 );

    // add cardinality constraint
    nClauses = pSat->stats.clauses;
    Vec_IntClear( vLits );
    Vec_IntFillNatural( vLits, Gia_ManAndNum(p->pGia) );
    Cnf_AddCardinConstrPairWise( pSat, vLits, Vec_IntSize(vBestNode)-2, 0 );
    printf( "Problem clauses = %d.  Cardinality clauses = %d.\n", nClauses, pSat->stats.clauses - nClauses );

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, 1000000, 0, 0, 0 );
    if ( status == l_Undef )
        printf( "Undecided.  " );
    if ( status == l_True )
        printf( "Satisfiable.  " );
    if ( status == l_False )
        printf( "Unsatisfiable. " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Sat_SolverPrintStats( stdout, pSat );
    if ( status == l_True )
    {
        int nOnes = 0;
        for ( v = 0; v < Gia_ManAndNum(p->pGia); v++ )
        {
            printf( "%d", sat_solver_var_value(pSat, v) );
            nOnes += sat_solver_var_value(pSat, v);
        }
        printf( " Nodes = %d\n", nOnes );

        nOnes = 0;
        for ( ; v < Gia_ManAndNum(p->pGia) + nCutsAll; v++ )
        {
            printf( "%d", sat_solver_var_value(pSat, v) );
            nOnes += sat_solver_var_value(pSat, v);
        }
        printf( " LUTs = %d\n", nOnes );
    }

    // cleanup
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
}